

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  BINARY_DATA amqp_data;
  int iVar1;
  SASL_MECHANISM_INTERFACE_DESCRIPTION *sasl_mechanism_interface_description;
  XIO_HANDLE sasl_mechanism;
  AMQP_VALUE xio;
  IO_INTERFACE_DESCRIPTION *io_interface_description;
  XIO_HANDLE xio_00;
  CONNECTION_HANDLE connection_00;
  SESSION_HANDLE session_00;
  AMQP_VALUE source_00;
  AMQP_VALUE target_00;
  LINK_HANDLE link_00;
  MESSAGE_HANDLE message_00;
  MESSAGE_SENDER_HANDLE message_sender_00;
  float local_11c;
  tickcounter_ms_t local_118;
  tickcounter_ms_t end_time;
  size_t maximum_memory_used;
  size_t current_memory_used;
  TICK_COUNTER_HANDLE tick_counter;
  tickcounter_ms_t start_time;
  _Bool keep_running;
  uchar *puStack_e8;
  uint32_t i;
  BINARY_DATA binary_data;
  uchar hello [5];
  XIO_HANDLE tls_io;
  SASL_MECHANISM_HANDLE sasl_mechanism_handle;
  size_t last_memory_used;
  AMQP_VALUE target;
  AMQP_VALUE source;
  SASLCLIENTIO_CONFIG sasl_io_config;
  IO_INTERFACE_DESCRIPTION *tlsio_interface;
  TLSIO_CONFIG tls_io_config;
  SASL_PLAIN_CONFIG sasl_plain_config;
  MESSAGE_HANDLE message;
  MESSAGE_SENDER_HANDLE message_sender;
  LINK_HANDLE link;
  SESSION_HANDLE session;
  CONNECTION_HANDLE connection;
  XIO_HANDLE sasl_io;
  int result;
  char **argv_local;
  int argc_local;
  
  iVar1 = platform_init();
  if (iVar1 == 0) {
    tls_io_config._32_8_ = anon_var_dwarf_23;
    memcpy(&tlsio_interface,&PTR_anon_var_dwarf_57_00170c98,0x28);
    sasl_mechanism_handle = (SASL_MECHANISM_HANDLE)0x0;
    binary_data.length._3_4_ = 0x6c6c6548;
    binary_data.length._7_1_ = 0x6f;
    sasl_mechanism_interface_description = saslplain_get_interface();
    sasl_mechanism =
         (XIO_HANDLE)
         saslmechanism_create
                   (sasl_mechanism_interface_description,
                    &tls_io_config.invoke_on_send_complete_callback_for_fragments);
    sasl_io_config.sasl_mechanism = (SASL_MECHANISM_HANDLE)platform_get_default_tlsio();
    xio = (AMQP_VALUE)
          xio_create((IO_INTERFACE_DESCRIPTION *)sasl_io_config.sasl_mechanism,&tlsio_interface);
    source = xio;
    sasl_io_config.underlying_io = sasl_mechanism;
    io_interface_description = saslclientio_get_interface_description();
    xio_00 = xio_create(io_interface_description,&source);
    connection_00 =
         connection_create(xio_00,
                           "<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>"
                           ,"some",(ON_NEW_ENDPOINT)0x0,(void *)0x0);
    connection_set_trace(connection_00,true);
    session_00 = session_create(connection_00,(ON_LINK_ATTACHED)0x0,(void *)0x0);
    session_set_incoming_window(session_00,0x7fffffff);
    session_set_outgoing_window(session_00,0x10000);
    source_00 = messaging_create_source("ingress");
    target_00 = messaging_create_target
                          (
                          "amqps://<<<Replace with your own EH host (like myeventhub.servicebus.windows.net)>>>/<<<Replace with your own EH name (like ingress_eh)>>>"
                          );
    link_00 = link_create(session_00,"sender-link",false,source_00,target_00);
    link_set_snd_settle_mode(link_00,'\0');
    link_set_max_message_size(link_00,0x10000);
    amqpvalue_destroy(source_00);
    amqpvalue_destroy(target_00);
    message_00 = message_create();
    puStack_e8 = (uchar *)((long)&binary_data.length + 3);
    binary_data.bytes = (uchar *)0x5;
    amqp_data.length = 5;
    amqp_data.bytes = puStack_e8;
    message_add_body_amqp_data(message_00,amqp_data);
    message_sender_00 =
         messagesender_create(link_00,(ON_MESSAGE_SENDER_STATE_CHANGED)0x0,(void *)0x0);
    iVar1 = messagesender_open(message_sender_00);
    if (iVar1 == 0) {
      start_time._3_1_ = 1;
      current_memory_used = (size_t)tickcounter_create();
      iVar1 = tickcounter_get_current_ms
                        ((TICK_COUNTER_HANDLE)current_memory_used,(tickcounter_ms_t *)&tick_counter)
      ;
      if (iVar1 == 0) {
        for (start_time._4_4_ = 0; start_time._4_4_ < 1000; start_time._4_4_ = start_time._4_4_ + 1)
        {
          messagesender_send_async
                    (message_sender_00,message_00,on_message_send_complete,message_00,10000);
        }
        message_destroy(message_00);
        do {
          if ((start_time._3_1_ & 1) == 0) break;
          connection_dowork(connection_00);
          maximum_memory_used = 0xffffffffffffffff;
          end_time = 0xffffffffffffffff;
          if (sasl_mechanism_handle != (SASL_MECHANISM_HANDLE)0xffffffffffffffff) {
            printf("Current memory usage:%lu (max:%lu)\r\n",0xffffffffffffffff,0xffffffffffffffff);
            sasl_mechanism_handle = (SASL_MECHANISM_HANDLE)maximum_memory_used;
          }
        } while (sent_messages != 1000);
        iVar1 = tickcounter_get_current_ms((TICK_COUNTER_HANDLE)current_memory_used,&local_118);
        if (iVar1 == 0) {
          local_11c = (float)(local_118 - (long)tick_counter);
          printf("Send %u messages in %lu ms: %.02f msgs/sec\r\n",
                 (double)(1000.0 / (local_11c / 1000.0)),1000,local_118 - (long)tick_counter);
        }
        else {
          printf("Error getting end time\r\n");
        }
      }
      else {
        printf("Error getting start time\r\n");
      }
    }
    else {
      message_destroy(message_00);
    }
    messagesender_destroy(message_sender_00);
    link_destroy(link_00);
    session_destroy(session_00);
    connection_destroy(connection_00);
    xio_destroy(xio_00);
    xio_destroy((XIO_HANDLE)xio);
    saslmechanism_destroy((SASL_MECHANISM_HANDLE)sasl_mechanism);
    platform_deinit();
    printf("Max memory usage:%lu\r\n",0xffffffffffffffff);
    printf("Current memory usage:%lu\r\n",0xffffffffffffffff);
    sasl_io._4_4_ = 0;
  }
  else {
    sasl_io._4_4_ = -1;
  }
  return sasl_io._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int result;

    (void)argc;
    (void)argv;

    if (platform_init() != 0)
    {
        result = -1;
    }
    else
    {
        XIO_HANDLE sasl_io;
        CONNECTION_HANDLE connection;
        SESSION_HANDLE session;
        LINK_HANDLE link;
        MESSAGE_SENDER_HANDLE message_sender;
        MESSAGE_HANDLE message;
        SASL_PLAIN_CONFIG sasl_plain_config = { EH_KEY_NAME, EH_KEY, NULL };
        TLSIO_CONFIG tls_io_config = { EH_HOST, 5671 };
        const IO_INTERFACE_DESCRIPTION* tlsio_interface;
        SASLCLIENTIO_CONFIG sasl_io_config;
        AMQP_VALUE source;
        AMQP_VALUE target;

        size_t last_memory_used = 0;
        SASL_MECHANISM_HANDLE sasl_mechanism_handle;
        XIO_HANDLE tls_io;
        unsigned char hello[] = { 'H', 'e', 'l', 'l', 'o' };
        BINARY_DATA binary_data;

        gballoc_init();

        /* create SASL PLAIN handler */
        sasl_mechanism_handle = saslmechanism_create(saslplain_get_interface(), &sasl_plain_config);

        /* create the TLS IO */
        tlsio_interface = platform_get_default_tlsio();
        tls_io = xio_create(tlsio_interface, &tls_io_config);

        /* create the SASL client IO using the TLS IO */
        sasl_io_config.underlying_io = tls_io;
        sasl_io_config.sasl_mechanism = sasl_mechanism_handle;
        sasl_io = xio_create(saslclientio_get_interface_description(), &sasl_io_config);

        /* create the connection, session and link */
        connection = connection_create(sasl_io, EH_HOST, "some", NULL, NULL);
        connection_set_trace(connection, true);
        session = session_create(connection, NULL, NULL);
        session_set_incoming_window(session, 2147483647);
        session_set_outgoing_window(session, 65536);

        source = messaging_create_source("ingress");
        target = messaging_create_target("amqps://" EH_HOST "/" EH_NAME);
        link = link_create(session, "sender-link", role_sender, source, target);
        link_set_snd_settle_mode(link, sender_settle_mode_unsettled);
        (void)link_set_max_message_size(link, 65536);

        amqpvalue_destroy(source);
        amqpvalue_destroy(target);

        message = message_create();

        binary_data.bytes = hello;
        binary_data.length = sizeof(hello);
        message_add_body_amqp_data(message, binary_data);

        /* create a message sender */
        message_sender = messagesender_create(link, NULL, NULL);
        if (messagesender_open(message_sender) == 0)
        {
            uint32_t i;
            bool keep_running = true;
            tickcounter_ms_t start_time;
            TICK_COUNTER_HANDLE tick_counter = tickcounter_create();

            if (tickcounter_get_current_ms(tick_counter, &start_time) != 0)
            {
                (void)printf("Error getting start time\r\n");
            }
            else
            {
                for (i = 0; i < msg_count; i++)
                {
                    /* timeout if it takes longer than 10s */
                    (void)messagesender_send_async(message_sender, message, on_message_send_complete, message, 10000);
                }

                message_destroy(message);

                while (keep_running)
                {
                    size_t current_memory_used;
                    size_t maximum_memory_used;
                    connection_dowork(connection);

                    current_memory_used = gballoc_getCurrentMemoryUsed();
                    maximum_memory_used = gballoc_getMaximumMemoryUsed();

                    if (current_memory_used != last_memory_used)
                    {
                        (void)printf("Current memory usage:%lu (max:%lu)\r\n", (unsigned long)current_memory_used, (unsigned long)maximum_memory_used);
                        last_memory_used = current_memory_used;
                    }

                    if (sent_messages == msg_count)
                    {
                        break;
                    }
                }

                {
                    tickcounter_ms_t end_time;
                    if (tickcounter_get_current_ms(tick_counter, &end_time) != 0)
                    {
                        (void)printf("Error getting end time\r\n");
                    }
                    else
                    {
                        (void)printf("Send %u messages in %lu ms: %.02f msgs/sec\r\n", (unsigned int)msg_count, (unsigned long)(end_time - start_time), (float)msg_count / ((float)(end_time - start_time) / 1000));
                    }
                }
            }
        }
        else
        {
            message_destroy(message);
        }

        messagesender_destroy(message_sender);
        link_destroy(link);
        session_destroy(session);
        connection_destroy(connection);
        xio_destroy(sasl_io);
        xio_destroy(tls_io);
        saslmechanism_destroy(sasl_mechanism_handle);
        platform_deinit();

        (void)printf("Max memory usage:%lu\r\n", (unsigned long)gballoc_getCurrentMemoryUsed());
        (void)printf("Current memory usage:%lu\r\n", (unsigned long)gballoc_getMaximumMemoryUsed());

        gballoc_deinit();

        result = 0;
    }

    return result;
}